

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::init(arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  type *ptVar1;
  uint uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  size_t sVar5;
  longlong lVar6;
  size_t sVar7;
  undefined8 uVar8;
  int in_EAX;
  uint i_1;
  entry *peVar9;
  undefined1 *puVar10;
  byte bVar11;
  uint i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  arg;
  undefined1 local_48 [32];
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar14 = *(ulong *)ctx;
  uVar15 = 0xf;
  if ((long)uVar14 < 0) {
    uVar15 = uVar14 & 0xffffffff;
  }
  peVar9 = (entry *)operator_new__(uVar15 * 0x30);
  if ((int)uVar15 != 0) {
    uVar13 = 0;
    do {
      *(undefined4 *)((long)&(peVar9->arg).type_ + uVar13) = 0;
      puVar3 = (undefined8 *)((long)&(peVar9->name).data_ + uVar13);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined4 *)((long)&(peVar9->arg).value_.field_0 + uVar13) = 0;
      uVar13 = uVar13 + 0x30;
    } while (uVar15 * 0x30 != uVar13);
  }
  this->map_ = peVar9;
  if (-1 < (long)uVar14) {
    bVar11 = 0;
    puVar10 = local_48;
    uVar15 = 0;
    do {
      iVar12 = (int)((0xfL << (bVar11 & 0x3f) & uVar14) >> (bVar11 & 0x3f));
      if (iVar12 == 1) {
        puVar3 = *(undefined8 **)(*(long *)(ctx + 8) + uVar15 * 0x10);
        pcVar4 = (char *)*puVar3;
        sVar5 = puVar3[1];
        lVar6 = puVar3[2];
        sVar7 = puVar3[3];
        uVar8 = puVar3[5];
        peVar9 = this->map_;
        uVar2 = this->size_;
        ptVar1 = &peVar9[uVar2].arg.type_;
        *(undefined8 *)ptVar1 = puVar3[4];
        *(undefined8 *)(ptVar1 + 2) = uVar8;
        peVar9[uVar2].arg.value_.field_0.long_long_value = lVar6;
        peVar9[uVar2].arg.value_.field_0.string.size = sVar7;
        peVar9[uVar2].name.data_ = pcVar4;
        peVar9[uVar2].name.size_ = sVar5;
        this->size_ = this->size_ + 1;
        uVar14 = *(ulong *)ctx;
      }
      else if (iVar12 == 0) {
LAB_0011df88:
        return (int)puVar10;
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      bVar11 = bVar11 + 4;
    } while( true );
  }
  puVar10 = (undefined1 *)0x0;
  do {
    iVar12 = *(int *)(*(long *)(ctx + 8) + 0x10 + (long)puVar10 * 0x20);
    if (iVar12 == 1) {
      puVar3 = *(undefined8 **)(*(long *)(ctx + 8) + (long)puVar10 * 0x20);
      pcVar4 = (char *)*puVar3;
      sVar5 = puVar3[1];
      lVar6 = puVar3[2];
      sVar7 = puVar3[3];
      uVar8 = puVar3[5];
      peVar9 = this->map_;
      uVar2 = this->size_;
      ptVar1 = &peVar9[uVar2].arg.type_;
      *(undefined8 *)ptVar1 = puVar3[4];
      *(undefined8 *)(ptVar1 + 2) = uVar8;
      peVar9[uVar2].arg.value_.field_0.long_long_value = lVar6;
      peVar9[uVar2].arg.value_.field_0.string.size = sVar7;
      peVar9[uVar2].name.data_ = pcVar4;
      peVar9[uVar2].name.size_ = sVar5;
      this->size_ = this->size_ + 1;
    }
    else if (iVar12 == 0) goto LAB_0011df88;
    puVar10 = (undefined1 *)(ulong)((int)puVar10 + 1);
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  if (args.is_packed()) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}